

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessage
          (BaseCase *this,MessageData *message,GLenum source,GLenum type,GLuint id,GLenum severity)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  bool bVar3;
  MessageBuilder *this_00;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  pTVar2 = ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  bVar3 = verifyMessageExists(this,message,source,type);
  if (bVar3) {
    verifyMessageString(this,message);
    verifyMessageGroup(this,message,source,type);
    if ((message->id).id != id) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"Incorrect message id",(allocator<char> *)&local_1d0);
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Message id was ");
      this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&(message->id).id);
      std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " when it should have been ");
      std::ostream::_M_insert<unsigned_long>((ulong)&this_00->m_str);
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    if (message->severity != 0x826b) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"Incorrect message severity",(allocator<char> *)&local_1d0);
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Message severity was ");
      local_1d0.m_value = message->severity;
      local_1d0.m_getName = glu::getDebugMessageSeverityName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," when it should have been ");
      local_1c0.m_getName = glu::getDebugMessageSeverityName;
      local_1c0.m_value = 0x826b;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
  }
  return;
}

Assistant:

void BaseCase::verifyMessage (const MessageData& message, GLenum source, GLenum type, GLuint id, GLenum severity)
{
	TestLog& log = m_testCtx.getLog();

	if (verifyMessageExists(message, source, type))
	{
		verifyMessageString(message);
		verifyMessageGroup(message, source, type);

		if (message.id.id != id)
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message id");
			log << TestLog::Message << "Message id was " << message.id.id
				<< " when it should have been " << id << TestLog::EndMessage;
		}

		if (message.severity != severity)
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message severity");
			log << TestLog::Message << "Message severity was " << glu::getDebugMessageSeverityStr(message.severity)
				<< " when it should have been " << glu::getDebugMessageSeverityStr(severity) << TestLog::EndMessage;
		}
	}
}